

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

UniquePtr<SSL_SESSION> __thiscall
bssl::anon_unknown_0::CreateTestSession(anon_unknown_0 *this,uint32_t number)

{
  bool bVar1;
  int iVar2;
  SSL_METHOD *meth;
  pointer __p;
  SSL_SESSION *__p_00;
  pointer session;
  uint8_t auStack_68 [8];
  uint8_t id [32];
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_30;
  UniquePtr<SSL_SESSION> ret;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_20;
  UniquePtr<SSL_CTX> ssl_ctx;
  uint32_t number_local;
  
  ssl_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl._4_4_ = number;
  meth = (SSL_METHOD *)TLS_method();
  __p = (pointer)SSL_CTX_new(meth);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&local_20,__p);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (bVar1) {
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&local_20);
    __p_00 = SSL_SESSION_new();
    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)&local_30,(pointer)__p_00);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
    if (bVar1) {
      id[8] = '\0';
      id[9] = '\0';
      id[10] = '\0';
      id[0xb] = '\0';
      id[0xc] = '\0';
      id[0xd] = '\0';
      id[0xe] = '\0';
      id[0xf] = '\0';
      id[0x10] = '\0';
      id[0x11] = '\0';
      id[0x12] = '\0';
      id[0x13] = '\0';
      id[0x14] = '\0';
      id[0x15] = '\0';
      id[0x16] = '\0';
      id[0x17] = '\0';
      auStack_68[0] = '\0';
      auStack_68[1] = '\0';
      auStack_68[2] = '\0';
      auStack_68[3] = '\0';
      auStack_68[4] = '\0';
      auStack_68[5] = '\0';
      auStack_68[6] = '\0';
      auStack_68[7] = '\0';
      id[0] = '\0';
      id[1] = '\0';
      id[2] = '\0';
      id[3] = '\0';
      id[4] = '\0';
      id[5] = '\0';
      id[6] = '\0';
      id[7] = '\0';
      ::OPENSSL_memcpy(auStack_68,
                       (void *)((long)&ssl_ctx._M_t.
                                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl + 4)
                       ,4);
      session = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_30);
      iVar2 = SSL_SESSION_set1_id(session,auStack_68,0x20);
      if (iVar2 == 0) {
        std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
      }
      else {
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::unique_ptr
                  ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)this,&local_30);
      }
    }
    else {
      std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    }
    ret._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  }
  else {
    std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
    ret._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ = 1;
  }
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<SSL_SESSION> CreateTestSession(uint32_t number) {
  bssl::UniquePtr<SSL_CTX> ssl_ctx(SSL_CTX_new(TLS_method()));
  if (!ssl_ctx) {
    return nullptr;
  }
  bssl::UniquePtr<SSL_SESSION> ret(SSL_SESSION_new(ssl_ctx.get()));
  if (!ret) {
    return nullptr;
  }

  uint8_t id[SSL3_SSL_SESSION_ID_LENGTH] = {0};
  OPENSSL_memcpy(id, &number, sizeof(number));
  if (!SSL_SESSION_set1_id(ret.get(), id, sizeof(id))) {
    return nullptr;
  }
  return ret;
}